

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O0

CrispyValue std_num(CrispyValue *value,Vm *vm)

{
  void *__src;
  size_t __n;
  long lVar1;
  char *__nptr;
  ObjString *object;
  double value_00;
  CrispyValue CVar2;
  undefined8 uStack_60;
  char acStack_58 [8];
  char *local_50;
  double local_48;
  double res;
  unsigned_long __vla_expr0;
  uint64_t local_30;
  ObjString *string;
  Vm *vm_local;
  CrispyValue *value_local;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_10;
  
  __vla_expr0 = (unsigned_long)acStack_58;
  string = (ObjString *)vm;
  vm_local = (Vm *)value;
  if ((value->type == OBJECT) && (((value->field_1).o_value)->type == OBJ_STRING)) {
    local_30 = (value->field_1).p_value;
    res = (double)(*(long *)(local_30 + 0x10) + 1);
    lVar1 = -(*(long *)(local_30 + 0x10) + 0x10U & 0xfffffffffffffff0);
    __src = *(void **)(local_30 + 0x18);
    __n = *(size_t *)(local_30 + 0x10);
    local_50 = acStack_58 + lVar1;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10bd2a;
    memcpy(acStack_58 + lVar1,__src,__n);
    __nptr = local_50;
    local_50[*(long *)(local_30 + 0x10)] = '\0';
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10bd43;
    value_00 = strtod(__nptr,(char **)0x0);
    local_48 = value_00;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10bd52;
    CVar2 = create_number(value_00);
    local_10 = CVar2.field_1;
    value_local._0_4_ = CVar2.type;
  }
  else {
    vm->err_flag = true;
    uStack_60 = 0x10bcc7;
    object = new_string(vm,"num() can only be used on strings",0x21);
    uStack_60 = 0x10bccf;
    CVar2 = create_object(&object->object);
    local_10 = CVar2.field_1;
    value_local._0_4_ = CVar2.type;
  }
  CVar2._4_4_ = 0;
  CVar2.type = (ValueType)value_local;
  CVar2.field_1.p_value = local_10.p_value;
  return CVar2;
}

Assistant:

CrispyValue std_num(CrispyValue *value, Vm *vm) {
    if (value[0].type != OBJECT || value[0].o_value->type != OBJ_STRING) {
        vm->err_flag = true;
        return create_object((Object *) new_string(vm, "num() can only be used on strings", 33));
    }

    ObjString *string = (ObjString *) value[0].o_value;
    char temp[string->length + 1];
    memcpy(temp, string->start, string->length);
    temp[string->length] = '\0';

    double res;
    res = strtod(temp, NULL);

    return create_number(res);
}